

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetStringRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,StringRefType *s,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  SizeType SVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *__dest;
  
  if (s->length < 0xe) {
    (this->data_).f.flags = 0x1c05;
    (this->data_).ss.str[0xd] = '\r' - (char)s->length;
    __dest = this;
  }
  else {
    (this->data_).f.flags = 0xc05;
    SVar1 = s->length;
    (this->data_).s.length = SVar1;
    __dest = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)(SVar1 + 1));
    (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)__dest);
  }
  memcpy(__dest,s->s,(ulong)s->length);
  *(undefined1 *)((long)&__dest->data_ + (ulong)s->length) = 0;
  return;
}

Assistant:

void SetStringRaw(StringRefType s, Allocator& allocator) {
        Ch* str = 0;
        if (ShortString::Usable(s.length)) {
            data_.f.flags = kShortStringFlag;
            data_.ss.SetLength(s.length);
            str = data_.ss.str;
        } else {
            data_.f.flags = kCopyStringFlag;
            data_.s.length = s.length;
            str = static_cast<Ch *>(allocator.Malloc((s.length + 1) * sizeof(Ch)));
            SetStringPointer(str);
        }
        std::memcpy(str, s, s.length * sizeof(Ch));
        str[s.length] = '\0';
    }